

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O0

void json_value_free_ex(json_settings *settings,json_value *value)

{
  json_type jVar1;
  _json_value *p_Var2;
  uint uVar3;
  json_value *cur_value;
  json_value *value_local;
  json_settings *settings_local;
  
  if (value != (json_value *)0x0) {
    value->parent = (_json_value *)0x0;
    cur_value = value;
    while (cur_value != (json_value *)0x0) {
      jVar1 = cur_value->type;
      if (jVar1 == json_object) {
        if ((cur_value->u).boolean == 0) {
          (*settings->mem_free)((cur_value->u).string.ptr,settings->user_data);
LAB_001065ba:
          p_Var2 = cur_value->parent;
          (*settings->mem_free)(cur_value,settings->user_data);
          cur_value = p_Var2;
        }
        else {
          uVar3 = (cur_value->u).boolean - 1;
          (cur_value->u).string.length = uVar3;
          cur_value = *(json_value **)((cur_value->u).string.ptr + (ulong)uVar3 * 0x18 + 0x10);
        }
      }
      else {
        if (jVar1 != json_array) {
          if (jVar1 == json_string) {
            (*settings->mem_free)((cur_value->u).string.ptr,settings->user_data);
          }
          goto LAB_001065ba;
        }
        if ((cur_value->u).boolean == 0) {
          (*settings->mem_free)((cur_value->u).string.ptr,settings->user_data);
          goto LAB_001065ba;
        }
        uVar3 = (cur_value->u).boolean - 1;
        (cur_value->u).string.length = uVar3;
        cur_value = *(json_value **)((cur_value->u).string.ptr + (ulong)uVar3 * 8);
      }
    }
  }
  return;
}

Assistant:

void json_value_free_ex (json_settings * settings, json_value * value)
{
   json_value * cur_value;

   if (!value)
      return;

   value->parent = 0;

   while (value)
   {
      switch (value->type)
      {
         case json_array:

            if (!value->u.array.length)
            {
               settings->mem_free (value->u.array.values, settings->user_data);
               break;
            }

            value = value->u.array.values [-- value->u.array.length];
            continue;

         case json_object:

            if (!value->u.object.length)
            {
               settings->mem_free (value->u.object.values, settings->user_data);
               break;
            }

            value = value->u.object.values [-- value->u.object.length].value;
            continue;

         case json_string:

            settings->mem_free (value->u.string.ptr, settings->user_data);
            break;

         default:
            break;
      };

      cur_value = value;
      value = value->parent;
      settings->mem_free (cur_value, settings->user_data);
   }
}